

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

bool __thiscall
matchit::impl::Id<mathiu::impl::List>::matchValue<mathiu::impl::List_const&>
          (Id<mathiu::impl::List> *this,List *v)

{
  bool bVar1;
  List *l;
  BlockT *pBVar2;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    l = internalValue(this);
    bVar1 = mathiu::impl::operator==(&l->super_ExprPtrList,&v->super_ExprPtrList);
    return bVar1;
  }
  pBVar2 = block(this);
  IdUtil<mathiu::impl::List>::bindValue<mathiu::impl::List_const&>
            (&(pBVar2->super_IdBlockBase<mathiu::impl::List>).mVariant,v);
  return true;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }